

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
bdNode::getFoundPeers_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,bdNode *this)

{
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator local_28;
  undefined1 local_19;
  bdNode *local_18;
  bdNode *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (bdNode *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_28,&local_30);
  __first = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(&this->mFoundPeers);
  __last = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->mFoundPeers);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<std::_List_iterator<std::__cxx11::string>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,local_28,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_node,
             (_List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_node);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->mFoundPeers);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> bdNode::getFoundPeers() {
    std::vector<std::string> res;
    res.insert(res.end(), mFoundPeers.begin(), mFoundPeers.end());
    mFoundPeers.clear();
    return res;
}